

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O3

void __thiscall
ncnn::ObjectsManager::do_objects_nms
          (ObjectsManager *this,vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *objects,
          float nms,float prob_threh)

{
  Mutex *__mutex;
  pointer *ppOVar1;
  pointer pOVar2;
  SafeOrderList<ncnn::ObjectBox> *this_00;
  SafeOrderList<ncnn::ObjectBox> *pSVar3;
  _List_node_base *p_Var4;
  iterator __position;
  undefined8 uVar5;
  SafeOrderList<ncnn::ObjectBox> *pSVar6;
  ulong uVar7;
  float fVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ObjectBox *__args;
  long lVar12;
  ObjectBoxNmsCondition match;
  ObjectBoxNmsCondition match_00;
  MutexLockGuard guard;
  
  pOVar2 = (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
      super__Vector_impl_data._M_finish != pOVar2) {
    (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl.
    super__Vector_impl_data._M_finish = pOVar2;
  }
  uVar10 = 0;
  uVar7 = (ulong)(long)(int)(prob_threh * 100.0) / this->step;
  if (0 < (int)uVar7) {
    uVar10 = uVar7 & 0xffffffff;
  }
  uVar11 = (int)this->prob_steps - 1;
  if (this->prob_steps <= uVar10) {
    uVar10 = (ulong)uVar11;
  }
  iVar9 = (int)uVar10;
  if (iVar9 <= (int)uVar11) {
    do {
      this_00 = (this->object_boxs_table).
                super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_start[(int)uVar11];
      __mutex = &this_00->mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      pSVar3 = (SafeOrderList<ncnn::ObjectBox> *)
               (this_00->container).
               super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl._M_node.
               super__List_node_base._M_next;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      while (pSVar3 != this_00) {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        p_Var4 = (this_00->container).
                 super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl._M_node
                 .super__List_node_base._M_next;
        __args = (ObjectBox *)(p_Var4 + 1);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        __position._M_current =
             (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>)._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<ncnn::ObjectBox,std::allocator<ncnn::ObjectBox>>::
          _M_realloc_insert<ncnn::ObjectBox_const&>
                    ((vector<ncnn::ObjectBox,std::allocator<ncnn::ObjectBox>> *)objects,__position,
                     __args);
        }
        else {
          uVar5 = p_Var4[2]._M_next;
          (__position._M_current)->prob = (float)(int)uVar5;
          (__position._M_current)->classid = (int)((ulong)uVar5 >> 0x20);
          fVar8 = __args->ymin;
          p_Var4 = *(_List_node_base **)((long)(p_Var4 + 1) + 8);
          (__position._M_current)->xmin = __args->xmin;
          (__position._M_current)->ymin = fVar8;
          *(_List_node_base **)&(__position._M_current)->xmax = p_Var4;
          ppOVar1 = &(objects->super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppOVar1 = *ppOVar1 + 1;
        }
        SafeOrderList<ncnn::ObjectBox>::pop_front(this_00);
        match.nms_threshold = nms;
        match.top_box = __args;
        match._12_4_ = 0;
        SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>(this_00,match)
        ;
        lVar12 = (long)iVar9;
        if (iVar9 < (int)uVar11) {
          do {
            pSVar3 = (this->object_boxs_table).
                     super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12];
            pthread_mutex_lock((pthread_mutex_t *)&pSVar3->mutex);
            pSVar6 = (SafeOrderList<ncnn::ObjectBox> *)
                     (pSVar3->container).
                     super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl.
                     _M_node.super__List_node_base._M_next;
            pthread_mutex_unlock((pthread_mutex_t *)&pSVar3->mutex);
            if (pSVar6 != pSVar3) {
              match_00.nms_threshold = nms;
              match_00.top_box = __args;
              match_00._12_4_ = 0;
              SafeOrderList<ncnn::ObjectBox>::remove_all_match<ncnn::ObjectBoxNmsCondition>
                        (pSVar3,match_00);
            }
            lVar12 = lVar12 + 1;
          } while (uVar11 != (uint)lVar12);
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        pSVar3 = (SafeOrderList<ncnn::ObjectBox> *)
                 (this_00->container).
                 super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>._M_impl._M_node
                 .super__List_node_base._M_next;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      }
      uVar11 = uVar11 - 1;
    } while (iVar9 <= (int)uVar11);
  }
  return;
}

Assistant:

void ObjectsManager::do_objects_nms(std::vector<ObjectBox> &objects, float nms, float prob_threh)
{
    objects.clear();
    int start = prob_steps - 1;
    int min_index = get_prob_index(prob_threh);
    for (; start >= min_index; start--)
    {
        TObjectBoxs &object_boxs = *object_boxs_table[start];
        if (object_boxs.empty())
        {
            continue;
        }

        do
        {
            ObjectBox &object_box = object_boxs.front();
            objects.push_back(object_box);
            object_boxs.pop_front();

            ObjectBoxNmsCondition condition(object_box, nms);
            object_boxs.remove_all_match(condition);

            do_object_boxs_table_nms(condition, min_index, start);
        } while (!object_boxs.empty());
    }
}